

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::parseICC(LodePNGICC *icc,uchar *data,size_t size)

{
  size_t pos_00;
  uint uVar1;
  uint uVar2;
  undefined4 *puVar3;
  ulong uVar4;
  void *pvVar5;
  int *piVar6;
  ulong in_RDX;
  uchar *in_RSI;
  undefined4 *in_RDI;
  float fVar7;
  LodePNGICCCurve *trc_1;
  uint type;
  LodePNGICCCurve *trc;
  size_t count;
  int channel;
  char c;
  size_t namepos;
  uint tagsize;
  size_t offset;
  size_t numtags;
  uint inputspace;
  uint version;
  size_t pos;
  size_t j;
  size_t i;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  ulong local_50;
  ulong local_48;
  uint local_40;
  uint local_3c;
  size_t local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  uchar *local_18;
  undefined4 *local_10;
  uint local_4;
  
  if (in_RDX < 0x84) {
    local_4 = 1;
  }
  else {
    in_RDI[0x15] = 0;
    in_RDI[0x11] = 0;
    in_RDI[0x1f] = 0;
    in_RDI[7] = 0;
    in_RDI[0x3c] = 0;
    in_RDI[0x2e] = 0;
    in_RDI[0x20] = 0;
    in_RDI[0x14] = 0;
    in_RDI[0x13] = 0;
    in_RDI[0x12] = 0;
    in_RDI[0x18] = 0;
    in_RDI[0x17] = 0;
    in_RDI[0x16] = 0;
    in_RDI[0x1b] = 0;
    in_RDI[0x1a] = 0;
    in_RDI[0x19] = 0;
    in_RDI[0x1e] = 0;
    in_RDI[0x1d] = 0;
    in_RDI[0x1c] = 0;
    local_38 = 8;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_3c = decodeICCUint32(in_RSI,in_RDX,&local_38);
    if (local_38 < local_20) {
      local_10[1] = local_3c >> 0x18;
      local_10[2] = local_3c >> 0x14 & 0xf;
      local_10[3] = local_3c >> 0x10 & 0xf;
      local_38 = 0x10;
      local_40 = decodeICCUint32(local_18,local_20,&local_38);
      if (local_38 < local_20) {
        if (local_40 == 0x47524159) {
          *local_10 = 1;
        }
        else if (local_40 == 0x52474220) {
          *local_10 = 2;
        }
        else {
          *local_10 = 0;
        }
        local_38 = 0x44;
        fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff68,(size_t *)0x140588);
        local_10[4] = fVar7;
        fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff68,(size_t *)0x1405ac);
        local_10[5] = fVar7;
        fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff68,(size_t *)0x1405d0);
        local_10[6] = fVar7;
        local_38 = 0x80;
        uVar1 = decodeICCUint32(local_18,local_20,&local_38);
        local_48 = (ulong)uVar1;
        if (local_38 < local_20) {
          for (local_28 = 0; pos_00 = local_38, local_28 < local_48; local_28 = local_28 + 1) {
            local_38 = local_38 + 4;
            uVar1 = decodeICCUint32(local_18,local_20,&local_38);
            local_50 = (ulong)uVar1;
            uVar1 = decodeICCUint32(local_18,local_20,&local_38);
            if ((local_20 <= local_38) || (local_20 <= local_50)) {
              return 1;
            }
            if (local_20 < local_50 + uVar1) {
              return 1;
            }
            if (uVar1 < 8) {
              return 1;
            }
            uVar1 = isICCword(local_18,local_20,pos_00,"wtpt");
            if (uVar1 == 0) {
              uVar1 = isICCword(local_18,local_20,pos_00,"rXYZ");
              if (uVar1 == 0) {
                uVar1 = isICCword(local_18,local_20,pos_00,"gXYZ");
                if (uVar1 == 0) {
                  uVar1 = isICCword(local_18,local_20,pos_00,"bXYZ");
                  if (uVar1 == 0) {
                    uVar1 = isICCword(local_18,local_20,pos_00,"chad");
                    if (uVar1 == 0) {
                      uVar1 = isICCword(local_18,local_20,pos_00,"rTRC");
                      if ((((uVar1 != 0) ||
                           (uVar1 = isICCword(local_18,local_20,pos_00,"gTRC"), uVar1 != 0)) ||
                          (uVar1 = isICCword(local_18,local_20,pos_00,"bTRC"), uVar1 != 0)) ||
                         (uVar1 = isICCword(local_18,local_20,pos_00,"kTRC"), uVar1 != 0)) {
                        if (local_18[pos_00] == 'b') {
                          uVar1 = 2;
                        }
                        else {
                          uVar1 = (uint)(local_18[pos_00] == 'g');
                        }
                        in_stack_ffffffffffffff74 = uVar1;
                        uVar2 = isICCword(local_18,local_20,local_50,"curv");
                        if (uVar2 != 0) {
                          puVar3 = local_10 + (long)(int)uVar1 * 0xe + 0x20;
                          local_10[0x1f] = 1;
                          local_50 = local_50 + 8;
                          uVar2 = decodeICCUint32(local_18,local_20,&local_50);
                          uVar4 = (ulong)uVar2;
                          if (uVar4 == 0) {
                            *puVar3 = 0;
                          }
                          else if (uVar4 == 1) {
                            *puVar3 = 2;
                            uVar2 = decodeICCUint16(local_18,local_20,&local_50);
                            puVar3[6] = (float)uVar2 / 256.0;
                          }
                          else {
                            *puVar3 = 1;
                            if ((local_20 < local_50 + uVar4 * 2) || (0x1000000 < uVar4)) {
                              return 1;
                            }
                            *(ulong *)(puVar3 + 4) = uVar4;
                            pvVar5 = lodepng_malloc(0x140c65);
                            *(void **)(puVar3 + 2) = pvVar5;
                            for (local_30 = 0; local_30 < uVar4; local_30 = local_30 + 1) {
                              uVar2 = decodeICCUint16(local_18,local_20,&local_50);
                              *(float *)(*(long *)(puVar3 + 2) + local_30 * 4) =
                                   (float)uVar2 * 1.5259022e-05;
                            }
                          }
                        }
                        uVar2 = isICCword(local_18,local_20,local_50,"para");
                        if (uVar2 != 0) {
                          piVar6 = local_10 + (long)(int)uVar1 * 0xe + 0x20;
                          local_10[0x1f] = 1;
                          local_50 = local_50 + 8;
                          uVar1 = decodeICCUint16(local_18,local_20,&local_50);
                          local_50 = local_50 + 2;
                          if (4 < uVar1) {
                            return 1;
                          }
                          *piVar6 = uVar1 + 2;
                          fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                       in_stack_ffffffffffffff70),
                                                     in_stack_ffffffffffffff68,(size_t *)0x140da1);
                          piVar6[6] = (int)fVar7;
                          if (uVar1 != 0) {
                            fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                         in_stack_ffffffffffffff70),
                                                       in_stack_ffffffffffffff68,(size_t *)0x140dc9)
                            ;
                            piVar6[7] = (int)fVar7;
                            fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                         in_stack_ffffffffffffff70),
                                                       in_stack_ffffffffffffff68,(size_t *)0x140dea)
                            ;
                            piVar6[8] = (int)fVar7;
                          }
                          if (1 < uVar1) {
                            fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                         in_stack_ffffffffffffff70),
                                                       in_stack_ffffffffffffff68,(size_t *)0x140e12)
                            ;
                            piVar6[9] = (int)fVar7;
                          }
                          if (2 < uVar1) {
                            fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                         in_stack_ffffffffffffff70),
                                                       in_stack_ffffffffffffff68,(size_t *)0x140e3a)
                            ;
                            piVar6[10] = (int)fVar7;
                          }
                          if (uVar1 == 4) {
                            fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                         in_stack_ffffffffffffff70),
                                                       in_stack_ffffffffffffff68,(size_t *)0x140e62)
                            ;
                            piVar6[0xb] = (int)fVar7;
                            fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                         in_stack_ffffffffffffff70),
                                                       in_stack_ffffffffffffff68,(size_t *)0x140e83)
                            ;
                            piVar6[0xc] = (int)fVar7;
                          }
                        }
                      }
                    }
                    else {
                      local_50 = local_50 + 8;
                      for (local_30 = 0; local_30 < 9; local_30 = local_30 + 1) {
                        fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                     in_stack_ffffffffffffff70),
                                                   in_stack_ffffffffffffff68,(size_t *)0x140a19);
                        local_10[local_30 + 8] = fVar7;
                      }
                      local_10[7] = 1;
                    }
                  }
                  else {
                    local_50 = local_50 + 8;
                    fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff68,(size_t *)0x140957);
                    local_10[0x1c] = fVar7;
                    fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff68,(size_t *)0x14097b);
                    local_10[0x1d] = fVar7;
                    fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff68,(size_t *)0x14099f);
                    local_10[0x1e] = fVar7;
                    local_10[0x15] = 1;
                  }
                }
                else {
                  local_50 = local_50 + 8;
                  fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                               in_stack_ffffffffffffff70),
                                             in_stack_ffffffffffffff68,(size_t *)0x1408a2);
                  local_10[0x19] = fVar7;
                  fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                               in_stack_ffffffffffffff70),
                                             in_stack_ffffffffffffff68,(size_t *)0x1408c6);
                  local_10[0x1a] = fVar7;
                  fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                               in_stack_ffffffffffffff70),
                                             in_stack_ffffffffffffff68,(size_t *)0x1408ea);
                  local_10[0x1b] = fVar7;
                  local_10[0x15] = 1;
                }
              }
              else {
                local_50 = local_50 + 8;
                fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                             in_stack_ffffffffffffff70),
                                           in_stack_ffffffffffffff68,(size_t *)0x1407ed);
                local_10[0x16] = fVar7;
                fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                             in_stack_ffffffffffffff70),
                                           in_stack_ffffffffffffff68,(size_t *)0x140811);
                local_10[0x17] = fVar7;
                fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                             in_stack_ffffffffffffff70),
                                           in_stack_ffffffffffffff68,(size_t *)0x140835);
                local_10[0x18] = fVar7;
                local_10[0x15] = 1;
              }
            }
            else {
              local_50 = local_50 + 8;
              fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                           in_stack_ffffffffffffff70),
                                         in_stack_ffffffffffffff68,(size_t *)0x140738);
              local_10[0x12] = fVar7;
              fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                           in_stack_ffffffffffffff70),
                                         in_stack_ffffffffffffff68,(size_t *)0x14075c);
              local_10[0x13] = fVar7;
              fVar7 = decodeICC15Fixed16((uchar *)CONCAT44(in_stack_ffffffffffffff74,
                                                           in_stack_ffffffffffffff70),
                                         in_stack_ffffffffffffff68,(size_t *)0x140780);
              local_10[0x14] = fVar7;
              local_10[0x11] = 1;
            }
            if (local_20 < local_50) {
              return 1;
            }
          }
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static unsigned parseICC(LodePNGICC* icc, const unsigned char* data, size_t size) {
  size_t i, j;
  size_t pos = 0;
  unsigned version;
  unsigned inputspace;
  size_t numtags;

  if(size < 132) return 1; /* Too small to be a valid icc profile. */

  icc->has_chromaticity = 0;
  icc->has_whitepoint = 0;
  icc->has_trc = 0;
  icc->has_chad = 0;

  icc->trc[0].type = icc->trc[1].type = icc->trc[2].type = 0;
  icc->white[0] = icc->white[1] = icc->white[2] = 0;
  icc->red[0] = icc->red[1] = icc->red[2] = 0;
  icc->green[0] = icc->green[1] = icc->green[2] = 0;
  icc->blue[0] = icc->blue[1] = icc->blue[2] = 0;

  pos = 8;
  version = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  icc->version_major = (int)((version >> 24) & 255);
  icc->version_minor = (int)((version >> 20) & 15);
  icc->version_bugfix = (int)((version >> 16) & 15);

  pos = 16;
  inputspace = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  if(inputspace == 0x47524159) {
    /* The string  "GRAY" as unsigned 32-bit int. */
    icc->inputspace = 1;
  } else if(inputspace == 0x52474220) {
    /* The string  "RGB " as unsigned 32-bit int. */
    icc->inputspace = 2;
  } else {
    /* unsupported by PNG (CMYK, YCbCr, Lab, HSV, ...) */
    icc->inputspace = 0;
  }

  /* Should always be 0.9642, 1.0, 0.8249 */
  pos = 68;
  icc->illuminant[0] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[1] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[2] = decodeICC15Fixed16(data, size, &pos);

  pos = 128;
  numtags = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  /* scan for tags we want to handle */
  for(i = 0; i < numtags; i++) {
    size_t offset;
    unsigned tagsize;
    size_t namepos = pos;
    pos += 4;
    offset = decodeICCUint32(data, size, &pos);
    tagsize = decodeICCUint32(data, size, &pos);
    if(pos >= size || offset >= size) return 1;
    if(offset + tagsize > size) return 1;
    if(tagsize < 8) return 1;

    if(isICCword(data, size, namepos, "wtpt")) {
      offset += 8; /* skip tag and reserved */
      icc->white[0] = decodeICC15Fixed16(data, size, &offset);
      icc->white[1] = decodeICC15Fixed16(data, size, &offset);
      icc->white[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_whitepoint = 1;
    } else if(isICCword(data, size, namepos, "rXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->red[0] = decodeICC15Fixed16(data, size, &offset);
      icc->red[1] = decodeICC15Fixed16(data, size, &offset);
      icc->red[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "gXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->green[0] = decodeICC15Fixed16(data, size, &offset);
      icc->green[1] = decodeICC15Fixed16(data, size, &offset);
      icc->green[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "bXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->blue[0] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[1] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "chad")) {
      offset += 8; /* skip datatype keyword "sf32" and reserved */
      for(j = 0; j < 9; j++) {
        icc->chad[j] = decodeICC15Fixed16(data, size, &offset);
      }
      icc->has_chad = 1;
    } else if(isICCword(data, size, namepos, "rTRC") ||
              isICCword(data, size, namepos, "gTRC") ||
              isICCword(data, size, namepos, "bTRC") ||
              isICCword(data, size, namepos, "kTRC")) {
      char c = (char)data[namepos];
      /* both 'k' and 'r' are stored in channel 0 */
      int channel = (c == 'b') ? 2 : (c == 'g' ? 1 : 0);
      /* "curv": linear, gamma power or LUT */
      if(isICCword(data, size, offset, "curv")) {
        size_t count;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "curv" and reserved */
        count = decodeICCUint32(data, size, &offset);
        if(count == 0) {
          trc->type = 0; /* linear */
        } else if(count == 1) {
          trc->type = 2; /* gamma */
          trc->gamma = decodeICCUint16(data, size, &offset) / 256.0f;
        } else {
          trc->type = 1; /* LUT */
          if(offset + count * 2 > size || count > 16777216) return 1; /* also avoid crazy count */
          trc->lut_size = count;
          trc->lut = (float*)lodepng_malloc(count * sizeof(float));
          for(j = 0; j < count; j++) {
            trc->lut[j] = decodeICCUint16(data, size, &offset) * (1.0f / 65535.0f);
          }
        }
      }
      /* "para": parametric formula with gamma power, multipliers, biases and comparison point */
      /* TODO: test this on a realistic sample */
      if(isICCword(data, size, offset, "para")) {
        unsigned type;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "para" and reserved */
        type = decodeICCUint16(data, size, &offset);
        offset += 2;
        if(type > 4) return 1; /* unknown parametric curve type */
        trc->type = type + 2;
        trc->gamma = decodeICC15Fixed16(data, size, &offset);
        if(type >= 1) {
          trc->a = decodeICC15Fixed16(data, size, &offset);
          trc->b = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 2) {
          trc->c = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 3) {
          trc->d = decodeICC15Fixed16(data, size, &offset);
        }
        if(type == 4) {
          trc->e = decodeICC15Fixed16(data, size, &offset);
          trc->f = decodeICC15Fixed16(data, size, &offset);
        }
      }
      /* TODO: verify: does the "chrm" tag participate in computation so should be parsed? */
    }
    /* Return error if any parse went beyond the filesize. Note that the
    parsing itself was always safe since it bound-checks inside. */
    if(offset > size) return 1;
  }

  return 0;
}